

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ALLEGRO_EVENT_QUEUE *unaff_retaddr;
  ALLEGRO_EVENT_QUEUE *queue;
  Token *in_stack_ffffffffffffffc0;
  
  uVar1 = al_install_system(0x85020700,atexit);
  if ((uVar1 & 1) == 0) {
    abort_example("Error initialising Allegro.\n");
  }
  uVar1 = al_install_audio();
  if (((uVar1 & 1) == 0) || (uVar1 = al_reserve_samples(0x80), (uVar1 & 1) == 0)) {
    abort_example("Error initialising audio.\n");
  }
  al_init_acodec_addon();
  al_init_image_addon();
  init_platform_specific();
  al_set_new_bitmap_flags(0xc0);
  display = (ALLEGRO_DISPLAY *)al_create_display(0x400,600);
  if (display == (ALLEGRO_DISPLAY *)0x0) {
    abort_example("Error creating display.\n");
  }
  al_set_window_title(display,"Haiku - A Musical Instrument");
  load_images();
  load_samples();
  init_tokens();
  init_buttons();
  init_glow();
  select_button(in_stack_ffffffffffffffc0);
  al_install_keyboard();
  al_install_mouse();
  refresh_timer = (ALLEGRO_TIMER *)al_create_timer(0x3f91111111111111);
  playback_timer = (ALLEGRO_TIMER *)al_create_timer(0x3fc5ddcc60000000);
  uVar2 = al_create_event_queue();
  uVar4 = uVar2;
  uVar3 = al_get_display_event_source(display);
  al_register_event_source(uVar4,uVar3);
  uVar4 = al_get_keyboard_event_source();
  al_register_event_source(uVar2,uVar4);
  uVar4 = al_get_mouse_event_source();
  al_register_event_source(uVar2,uVar4);
  uVar4 = al_get_timer_event_source(refresh_timer);
  al_register_event_source(uVar2,uVar4);
  uVar4 = al_get_timer_event_source(playback_timer);
  al_register_event_source(uVar2,uVar4);
  uVar1 = al_is_touch_input_installed();
  if ((uVar1 & 1) != 0) {
    uVar4 = al_get_touch_input_mouse_emulation_event_source();
    al_register_event_source(uVar2,uVar4);
  }
  al_start_timer(refresh_timer);
  al_start_timer(playback_timer);
  main_loop(unaff_retaddr);
  free_all_flairs();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_EVENT_QUEUE *queue;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Error initialising Allegro.\n");
   }
   if (!al_install_audio() || !al_reserve_samples(128)) {
      abort_example("Error initialising audio.\n");
   }
   al_init_acodec_addon();
   al_init_image_addon();
   init_platform_specific();

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR);

   display = al_create_display(screen_w, screen_h);
   if (!display) {
      abort_example("Error creating display.\n");
   }
   al_set_window_title(display, "Haiku - A Musical Instrument");

   load_images();
   load_samples();

   init_tokens();
   init_buttons();
   init_glow();
   select_button(&buttons[TYPE_EARTH]);

   al_install_keyboard();
   al_install_mouse();

   refresh_timer = al_create_timer(1.0 / refresh_rate);
   playback_timer = al_create_timer(playback_period / TOKENS_X);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_timer_event_source(refresh_timer));
   al_register_event_source(queue, al_get_timer_event_source(playback_timer));
   if (al_is_touch_input_installed()) {
      al_register_event_source(queue,
         al_get_touch_input_mouse_emulation_event_source());
   }

   al_start_timer(refresh_timer);
   al_start_timer(playback_timer);

   main_loop(queue);

   free_all_flairs();

   return 0;
}